

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O0

void av1_get_fwd_txfm_cfg(TX_TYPE tx_type,TX_SIZE tx_size,TXFM_2D_FLIP_CFG *cfg)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte *in_RDX;
  byte in_SIL;
  byte in_DIL;
  TXFM_2D_FLIP_CFG *unaff_retaddr;
  int txh_idx;
  int txw_idx;
  TX_TYPE_1D tx_type_1d_row;
  TX_TYPE_1D tx_type_1d_col;
  TXFM_2D_FLIP_CFG *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe4;
  
  *in_RDX = in_SIL;
  set_flip_cfg((TX_TYPE)((uint)in_stack_ffffffffffffffe4 >> 0x18),in_stack_ffffffffffffffd8);
  bVar1 = ""[in_DIL];
  bVar2 = ""[in_DIL];
  iVar3 = get_txw_idx(in_SIL);
  iVar4 = get_txh_idx(in_SIL);
  *(int8_t **)(in_RDX + 0x10) = av1_fwd_txfm_shift_ls[in_SIL];
  in_RDX[0x18] = av1_fwd_cos_bit_col[iVar3][iVar4];
  in_RDX[0x19] = av1_fwd_cos_bit_row[iVar3][iVar4];
  in_RDX[0x32] = av1_txfm_type_ls[iVar4][bVar1];
  in_RDX[0x33] = av1_txfm_type_ls[iVar3][bVar2];
  *(int *)(in_RDX + 0x34) = (int)"\x04\x06\b\n\f\a\b\n\x01\x01\x01\x01"[in_RDX[0x32]];
  *(int *)(in_RDX + 0x38) = (int)"\x04\x06\b\n\f\a\b\n\x01\x01\x01\x01"[in_RDX[0x33]];
  set_fwd_txfm_non_scale_range(unaff_retaddr);
  return;
}

Assistant:

void av1_get_fwd_txfm_cfg(TX_TYPE tx_type, TX_SIZE tx_size,
                          TXFM_2D_FLIP_CFG *cfg) {
  assert(cfg != NULL);
  cfg->tx_size = tx_size;
  set_flip_cfg(tx_type, cfg);
  const TX_TYPE_1D tx_type_1d_col = vtx_tab[tx_type];
  const TX_TYPE_1D tx_type_1d_row = htx_tab[tx_type];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  cfg->shift = av1_fwd_txfm_shift_ls[tx_size];
  cfg->cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  cfg->cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  cfg->txfm_type_col = av1_txfm_type_ls[txh_idx][tx_type_1d_col];
  assert(cfg->txfm_type_col != TXFM_TYPE_INVALID);
  cfg->txfm_type_row = av1_txfm_type_ls[txw_idx][tx_type_1d_row];
  assert(cfg->txfm_type_row != TXFM_TYPE_INVALID);
  cfg->stage_num_col = av1_txfm_stage_num_list[cfg->txfm_type_col];
  cfg->stage_num_row = av1_txfm_stage_num_list[cfg->txfm_type_row];
  set_fwd_txfm_non_scale_range(cfg);
}